

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_to_all_zero_digital_filter_coefficients.cc
# Opt level: O1

bool __thiscall
sptk::AllPoleToAllZeroDigitalFilterCoefficients::Run
          (AllPoleToAllZeroDigitalFilterCoefficients *this,
          vector<double,_std::allocator<double>_> *input_filter_coefficients,
          vector<double,_std::allocator<double>_> *output_filter_coefficients)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  pointer pdVar5;
  size_type __new_size;
  
  if (this->is_valid_ == true) {
    __new_size = (long)this->num_order_ + 1;
    pdVar2 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 == __new_size) {
      bVar4 = false;
      if ((output_filter_coefficients != (vector<double,_std::allocator<double>_> *)0x0) &&
         ((dVar1 = *pdVar2, dVar1 != 0.0 || (bVar4 = false, NAN(dVar1))))) {
        if ((long)(output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize
                    (output_filter_coefficients,__new_size);
        }
        pdVar2 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        dVar1 = *pdVar2;
        pdVar5 = (output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *pdVar5 = 1.0 / dVar1;
        pdVar3 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar4 = true;
        while (pdVar2 = pdVar2 + 1, pdVar2 != pdVar3) {
          pdVar5 = pdVar5 + 1;
          *pdVar5 = *pdVar2 * (1.0 / dVar1);
        }
      }
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool AllPoleToAllZeroDigitalFilterCoefficients::Run(
    const std::vector<double>& input_filter_coefficients,
    std::vector<double>* output_filter_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      input_filter_coefficients.size() != static_cast<std::size_t>(length) ||
      0.0 == input_filter_coefficients[0] ||
      NULL == output_filter_coefficients) {
    return false;
  }

  // Prepare memories.
  if (output_filter_coefficients->size() != static_cast<std::size_t>(length)) {
    output_filter_coefficients->resize(length);
  }

  // Perform conversion.
  const double z(1.0 / input_filter_coefficients[0]);
  (*output_filter_coefficients)[0] = z;
  std::transform(
      input_filter_coefficients.begin() + 1, input_filter_coefficients.end(),
      output_filter_coefficients->begin() + 1, [z](double x) { return x * z; });

  return true;
}